

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET vepu511_h265_set_feedback(H265eV511HalContext *ctx,HalEncTask *enc_task)

{
  uint uVar1;
  EncRcTask *pEVar2;
  Vepu511H265eFrmCfg *pVVar3;
  H265eV511StatusElem *pHVar4;
  uint uVar5;
  RK_U32 hw_status;
  H265eV511StatusElem *elem;
  RK_S32 mb4_num;
  RK_S32 mb8_num;
  MppEncCfgSet *cfg;
  Vepu511H265Fbk *fb;
  Vepu511H265eFrmCfg *frm;
  EncRcTaskInfo *hal_rc_ret;
  HalEncTask *enc_task_local;
  H265eV511HalContext *ctx_local;
  
  pEVar2 = enc_task->rc_task;
  pVVar3 = ctx->frms[(enc_task->flags).reg_idx];
  uVar5 = (int)(((ctx->cfg->prep).width + 7U & 0xfffffff8) *
               ((ctx->cfg->prep).height + 7U & 0xfffffff8)) / 0x40;
  pHVar4 = pVVar3->regs_ret;
  uVar1 = pHVar4->hw_status;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x97a);
  }
  (pVVar3->feedback).qp_sum = (pHVar4->st).qp_sum + (pVVar3->feedback).qp_sum;
  (pVVar3->feedback).out_strm_size = (pHVar4->st).bs_lgth_l32 + (pVVar3->feedback).out_strm_size;
  (pVVar3->feedback).sse_sum =
       (ulong)((pHVar4->st).sse_h32 << 0x10) + (long)(int)((uint)(pHVar4->st).st_sse_bsl >> 0x10) +
       (pVVar3->feedback).sse_sum;
  (pVVar3->feedback).hw_status = uVar1;
  if ((hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","hw_status: 0x%08x",(char *)0x0,(ulong)uVar1);
  }
  if ((uVar1 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_LINKTABLE_FINISH","vepu511_h265_set_feedback");
  }
  if (((uVar1 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if (((uVar1 & 8) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
  }
  if ((uVar1 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_WRITE_FULL","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_WRITE_ERROR","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x80) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_READ_ERROR","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x100) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_TIMEOUT_ERROR","vepu511_h265_set_feedback");
  }
  (pVVar3->feedback).st_mb_num =
       ((uint)(pHVar4->st).st_bnum_b16 & 0x7fffff) + (pVVar3->feedback).st_mb_num;
  (pVVar3->feedback).st_lvl64_inter_num =
       ((uint)(pHVar4->st).st_pnum_p64 & 0x1ffff) + (pVVar3->feedback).st_lvl64_inter_num;
  (pVVar3->feedback).st_lvl32_inter_num =
       ((uint)(pHVar4->st).st_pnum_p32 & 0x7ffff) + (pVVar3->feedback).st_lvl32_inter_num;
  (pVVar3->feedback).st_lvl32_intra_num =
       ((uint)(pHVar4->st).st_pnum_i32 & 0x7ffff) + (pVVar3->feedback).st_lvl32_intra_num;
  (pVVar3->feedback).st_lvl16_inter_num =
       ((uint)(pHVar4->st).st_pnum_p16 & 0x1fffff) + (pVVar3->feedback).st_lvl16_inter_num;
  (pVVar3->feedback).st_lvl16_intra_num =
       ((uint)(pHVar4->st).st_pnum_i16 & 0x1fffff) + (pVVar3->feedback).st_lvl16_intra_num;
  (pVVar3->feedback).st_lvl8_inter_num =
       ((uint)(pHVar4->st).st_pnum_p8 & 0x7fffff) + (pVVar3->feedback).st_lvl8_inter_num;
  (pVVar3->feedback).st_lvl8_intra_num =
       ((uint)(pHVar4->st).st_pnum_i8 & 0x7fffff) + (pVVar3->feedback).st_lvl8_intra_num;
  (pVVar3->feedback).st_lvl4_intra_num =
       ((uint)(pHVar4->st).st_pnum_i4 & 0x7fffff) + (pVVar3->feedback).st_lvl4_intra_num;
  (ctx->feedback).acc_cover16_num = (uint)(pHVar4->st).st_skin_sum1 & 0x7fff;
  (ctx->feedback).acc_bndry16_num = (uint)(pHVar4->st).st_skin_sum2 & 0x7fff;
  (ctx->feedback).acc_zero_mv = (pHVar4->st).acc_zero_mv;
  (ctx->feedback).st_ctu_num = (uint)(pHVar4->st).st_bnum_b16 & 0x7fffff;
  memcpy((pVVar3->feedback).st_cu_num_qp,(pHVar4->st).st_b8_qp,0xd0);
  if (0 < (int)(uVar5 << 2)) {
    (pEVar2->info).iblk4_prop =
         ((((pVVar3->feedback).st_lvl4_intra_num + (pVVar3->feedback).st_lvl8_intra_num) * 4 +
           (pVVar3->feedback).st_lvl16_intra_num * 0x10 +
          (pVVar3->feedback).st_lvl32_intra_num * 0x40) * 0x100) / (uVar5 << 2);
  }
  if (0 < (int)uVar5) {
    (pEVar2->info).quality_real = (pVVar3->feedback).qp_sum / uVar5;
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x9b8);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu511_h265_set_feedback(H265eV511HalContext *ctx, HalEncTask *enc_task)
{
    EncRcTaskInfo *hal_rc_ret = (EncRcTaskInfo *)&enc_task->rc_task->info;
    Vepu511H265eFrmCfg *frm = ctx->frms[enc_task->flags.reg_idx];
    Vepu511H265Fbk  *fb = &frm->feedback;
    MppEncCfgSet    *cfg = ctx->cfg;
    RK_S32 mb8_num = MPP_ALIGN(cfg->prep.width, 8) * MPP_ALIGN(cfg->prep.height, 8) / 64;
    RK_S32 mb4_num = (mb8_num << 2);
    H265eV511StatusElem *elem = (H265eV511StatusElem *)frm->regs_ret;
    RK_U32 hw_status = elem->hw_status;

    hal_h265e_enter();

    fb->qp_sum += elem->st.qp_sum;
    fb->out_strm_size += elem->st.bs_lgth_l32;
    fb->sse_sum += (RK_S64)(elem->st.sse_h32 << 16) +
                   (elem->st.st_sse_bsl.sse_l16 & 0xffff);

    fb->hw_status = hw_status;
    hal_h265e_dbg_detail("hw_status: 0x%08x", hw_status);
    if (hw_status & RKV_ENC_INT_LINKTABLE_FINISH)
        hal_h265e_err("RKV_ENC_INT_LINKTABLE_FINISH");

    if (hw_status & RKV_ENC_INT_ONE_FRAME_FINISH)
        hal_h265e_dbg_detail("RKV_ENC_INT_ONE_FRAME_FINISH");

    if (hw_status & RKV_ENC_INT_ONE_SLICE_FINISH)
        hal_h265e_dbg_detail("RKV_ENC_INT_ONE_SLICE_FINISH");

    if (hw_status & RKV_ENC_INT_SAFE_CLEAR_FINISH)
        hal_h265e_err("RKV_ENC_INT_SAFE_CLEAR_FINISH");

    if (hw_status & RKV_ENC_INT_BIT_STREAM_OVERFLOW)
        hal_h265e_err("RKV_ENC_INT_BIT_STREAM_OVERFLOW");

    if (hw_status & RKV_ENC_INT_BUS_WRITE_FULL)
        hal_h265e_err("RKV_ENC_INT_BUS_WRITE_FULL");

    if (hw_status & RKV_ENC_INT_BUS_WRITE_ERROR)
        hal_h265e_err("RKV_ENC_INT_BUS_WRITE_ERROR");

    if (hw_status & RKV_ENC_INT_BUS_READ_ERROR)
        hal_h265e_err("RKV_ENC_INT_BUS_READ_ERROR");

    if (hw_status & RKV_ENC_INT_TIMEOUT_ERROR)
        hal_h265e_err("RKV_ENC_INT_TIMEOUT_ERROR");

    fb->st_mb_num += elem->st.st_bnum_b16.num_b16;

    fb->st_lvl64_inter_num += elem->st.st_pnum_p64.pnum_p64;
    fb->st_lvl32_inter_num += elem->st.st_pnum_p32.pnum_p32;
    fb->st_lvl32_intra_num += elem->st.st_pnum_i32.pnum_i32;
    fb->st_lvl16_inter_num += elem->st.st_pnum_p16.pnum_p16;
    fb->st_lvl16_intra_num += elem->st.st_pnum_i16.pnum_i16;
    fb->st_lvl8_inter_num  += elem->st.st_pnum_p8.pnum_p8;
    fb->st_lvl8_intra_num  += elem->st.st_pnum_i8.pnum_i8;
    fb->st_lvl4_intra_num  += elem->st.st_pnum_i4.pnum_i4;

    ctx->feedback.acc_cover16_num = elem->st.st_skin_sum1.num1_point_skin;
    ctx->feedback.acc_bndry16_num = elem->st.st_skin_sum2.num2_point_skin;
    ctx->feedback.acc_zero_mv = elem->st.acc_zero_mv;
    ctx->feedback.st_ctu_num = elem->st.st_bnum_b16.num_b16;
    memcpy(&fb->st_cu_num_qp[0], &elem->st.st_b8_qp, 52 * sizeof(RK_U32));

    if (mb4_num > 0)
        hal_rc_ret->iblk4_prop =  ((((fb->st_lvl4_intra_num + fb->st_lvl8_intra_num) << 2) +
                                    (fb->st_lvl16_intra_num << 4) +
                                    (fb->st_lvl32_intra_num << 6)) << 8) / mb4_num;

    if (mb8_num > 0) {
        hal_rc_ret->quality_real = fb->qp_sum / mb8_num;
    }

    hal_h265e_leave();
    return MPP_OK;
}